

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

uint32_t predict_sublearner_adf(warm_cb *data,multi_learner *base,example *ec,uint32_t i)

{
  reference ppeVar1;
  action_score *paVar2;
  undefined4 in_ECX;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_RSI;
  long in_RDI;
  example *in_stack_00000058;
  warm_cb *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffe0;
  
  copy_example_to_adf(in_stack_00000060,in_stack_00000058);
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            (in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),0);
  paVar2 = v_array<ACTION_SCORE::action_score>::operator[]
                     ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar1)->pred).scalars,0);
  return paVar2->action + 1;
}

Assistant:

uint32_t predict_sublearner_adf(warm_cb& data, multi_learner& base, example& ec, uint32_t i)
{
	copy_example_to_adf(data, ec);
	base.predict(data.ecs, i);
	return data.ecs[0]->pred.a_s[0].action+1;
}